

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O3

void __thiscall
Diligent::anon_unknown_0::EngineFactoryVkImpl::CreateSwapChainVk
          (EngineFactoryVkImpl *this,IRenderDevice *pDevice,IDeviceContext *pImmediateContext,
          SwapChainDesc *SCDesc,NativeWindow *Window,ISwapChain **ppSwapChain)

{
  SwapChainVkImpl *this_00;
  DeviceContextVkImpl *pDeviceContextVk;
  RenderDeviceVkImpl *pDeviceVk;
  string msg;
  DeviceContextVkImpl *local_60;
  RenderDeviceVkImpl *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined4 local_30;
  
  if (ppSwapChain == (ISwapChain **)0x0) {
    FormatString<char[22]>((string *)local_50,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"CreateSwapChainVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
               ,0x5cb);
    if ((undefined1 *)local_50._0_8_ != local_40) {
      operator_delete((void *)local_50._0_8_,local_40._0_8_ + 1);
    }
  }
  else {
    *ppSwapChain = (ISwapChain *)0x0;
    if (pDevice != (IRenderDevice *)0x0) {
      CheckDynamicType<Diligent::RenderDeviceVkImpl,Diligent::IRenderDevice>(pDevice);
    }
    local_58 = (RenderDeviceVkImpl *)pDevice;
    if (pImmediateContext != (IDeviceContext *)0x0) {
      CheckDynamicType<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>(pImmediateContext);
    }
    local_60 = (DeviceContextVkImpl *)pImmediateContext;
    local_50._0_8_ = GetRawAllocator();
    local_50._8_8_ = 0;
    local_40._0_8_ = "SwapChainVkImpl instance";
    local_40._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
    ;
    local_30 = 0x5d7;
    this_00 = MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>::operator()
                        ((MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator> *)
                         local_50,SCDesc,&local_58,&local_60,Window);
    SwapChainVkImpl::QueryInterface(this_00,(INTERFACE_ID *)IID_SwapChain,(IObject **)ppSwapChain);
  }
  return;
}

Assistant:

void EngineFactoryVkImpl::CreateSwapChainVk(IRenderDevice*       pDevice,
                                            IDeviceContext*      pImmediateContext,
                                            const SwapChainDesc& SCDesc,
                                            const NativeWindow&  Window,
                                            ISwapChain**         ppSwapChain)
{
    DEV_CHECK_ERR(ppSwapChain, "Null pointer provided");
    if (!ppSwapChain)
        return;

    *ppSwapChain = nullptr;

    try
    {
        RenderDeviceVkImpl*  pDeviceVk        = ClassPtrCast<RenderDeviceVkImpl>(pDevice);
        DeviceContextVkImpl* pDeviceContextVk = ClassPtrCast<DeviceContextVkImpl>(pImmediateContext);
        IMemoryAllocator&    RawMemAllocator  = GetRawAllocator();

        SwapChainVkImpl* pSwapChainVk = NEW_RC_OBJ(RawMemAllocator, "SwapChainVkImpl instance", SwapChainVkImpl)(SCDesc, pDeviceVk, pDeviceContextVk, Window);
        pSwapChainVk->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));
    }
    catch (const std::runtime_error&)
    {
        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to create the swap chain");
    }
}